

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestRacingTailCaller::foo(TestRacingTailCaller *this,FooContext context)

{
  TestRacingTailCaller *this_local;
  FooContext context_local;
  
  kj::Promise<void>::
  then<capnp::_::(anonymous_namespace)::TestRacingTailCaller::foo(capnp::CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>)::_lambda()_1_>
            ((Promise<void> *)this,(Type *)(context.hook + 1));
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> foo(FooContext context) override {
    return unblock.then([context]() mutable {
      auto tailRequest = context.getParams().getCallee().fooRequest();
      return context.tailCall(kj::mv(tailRequest));
    });
  }